

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O0

void __thiscall LowererMD::EmitInsertInt64(LowererMD *this,Opnd *src,uint index,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  OpCode opcode_00;
  BOOL BVar3;
  int iVar4;
  Opnd *this_00;
  undefined4 *puVar5;
  IntConstOpnd *src2Opnd;
  Instr *pIVar6;
  ThreadContextInfo *pTVar7;
  undefined4 extraout_var;
  MemRefOpnd *pMVar8;
  Instr *newInstr;
  OpCode opcode;
  MemRefOpnd *tmp;
  Opnd *mem;
  intptr_t tempSIMD;
  Opnd *dst;
  Instr *instr_local;
  uint index_local;
  Opnd *src_local;
  LowererMD *this_local;
  
  this_00 = IR::Instr::GetDst(instr);
  bVar2 = IR::Opnd::IsSimd128(this_00);
  if ((!bVar2) || (bVar2 = IR::Opnd::IsInt64(src), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x232,"(dst->IsSimd128() && src->IsInt64())",
                       "dst->IsSimd128() && src->IsInt64()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  BVar3 = AutoSystemInfo::SSE4_1Available(&AutoSystemInfo::Data);
  if (BVar3 == 0) {
    pTVar7 = Func::GetThreadContextInfo(this->m_func);
    iVar4 = (*pTVar7->_vptr_ThreadContextInfo[8])(pTVar7,0);
    pMVar8 = IR::MemRefOpnd::New(CONCAT44(extraout_var,iVar4),TyUint64,this->m_func,
                                 AddrOpndKindDynamicMisc);
    Lowerer::InsertMove(&pMVar8->super_Opnd,src,instr,true);
    pMVar8 = IR::MemRefOpnd::New(CONCAT44(extraout_var,iVar4),TyFloat64,this->m_func,
                                 AddrOpndKindDynamicMisc);
    opcode_00 = MOVLPD;
    if (index != 0) {
      opcode_00 = MOVHPD;
    }
    pIVar6 = IR::Instr::New(opcode_00,this_00,&pMVar8->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar6);
    IR::Instr::HoistMemRefAddress(pIVar6,pMVar8,MOV);
    Legalize<false>(pIVar6,false);
  }
  else {
    src2Opnd = IR::IntConstOpnd::New((ulong)index,TyInt8,this->m_func,true);
    pIVar6 = IR::Instr::New(PINSRQ,this_00,src,&src2Opnd->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar6);
  }
  return;
}

Assistant:

void LowererMD::EmitInsertInt64(IR::Opnd* src, uint index, IR::Instr *instr)
{
    IR::Opnd* dst = instr->GetDst();
    Assert(dst->IsSimd128() && src->IsInt64());

    if (AutoSystemInfo::Data.SSE4_1Available())
    {
#ifdef _M_IX86
        index *= 2;
        Int64RegPair srcPair = m_func->FindOrCreateInt64Pair(src);
        instr->InsertBefore(IR::Instr::New(Js::OpCode::PINSRD, dst, srcPair.low, IR::IntConstOpnd::New(index, TyInt8, m_func, true), m_func));
        instr->InsertBefore(IR::Instr::New(Js::OpCode::PINSRD, dst, srcPair.high, IR::IntConstOpnd::New(index + 1, TyInt8, m_func, true), m_func));
#else
        instr->InsertBefore(IR::Instr::New(Js::OpCode::PINSRQ, dst, src, IR::IntConstOpnd::New(index, TyInt8, m_func, true), m_func));
#endif
}
    else
    {
        intptr_t tempSIMD = m_func->GetThreadContextInfo()->GetSimdTempAreaAddr(0);
#ifdef _M_IX86
        Int64RegPair src1Pair = m_func->FindOrCreateInt64Pair(src);
        IR::Opnd* lower = IR::MemRefOpnd::New(tempSIMD, TyMachPtr, m_func);
        m_lowerer->InsertMove(lower, src1Pair.low, instr);
        IR::Opnd* higher = IR::MemRefOpnd::New(tempSIMD + 4, TyMachPtr, m_func);
        m_lowerer->InsertMove(higher, src1Pair.high, instr);
#else
        IR::Opnd* mem = IR::MemRefOpnd::New(tempSIMD, TyMachPtr, m_func);
        m_lowerer->InsertMove(mem, src, instr);
#endif

        IR::MemRefOpnd* tmp = IR::MemRefOpnd::New(tempSIMD, TyFloat64, m_func);
        Js::OpCode opcode = (index) ? Js::OpCode::MOVHPD : Js::OpCode::MOVLPD;
        IR::Instr* newInstr = IR::Instr::New(opcode, dst, tmp, m_func);
        instr->InsertBefore(newInstr);
        newInstr->HoistMemRefAddress(tmp, Js::OpCode::MOV);
        Legalize(newInstr);
    }
}